

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O0

void __thiscall QSupportedWritingSystems::detach(QSupportedWritingSystems *this)

{
  bool bVar1;
  int iVar2;
  QWritingSystemsPrivate *this_00;
  long *in_RDI;
  QWritingSystemsPrivate *newd;
  QWritingSystemsPrivate *in_stack_ffffffffffffffd8;
  void *pvVar3;
  
  iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x78d9ef);
  if (iVar2 != 1) {
    this_00 = (QWritingSystemsPrivate *)operator_new(0x20);
    QWritingSystemsPrivate::QWritingSystemsPrivate(this_00,in_stack_ffffffffffffffd8);
    bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x78da2a);
    if ((!bVar1) && (pvVar3 = (void *)*in_RDI, pvVar3 != (void *)0x0)) {
      QWritingSystemsPrivate::~QWritingSystemsPrivate((QWritingSystemsPrivate *)0x78da49);
      operator_delete(pvVar3,0x20);
    }
    *in_RDI = (long)this_00;
  }
  return;
}

Assistant:

void QSupportedWritingSystems::detach()
{
    if (d->ref.loadRelaxed() != 1) {
        QWritingSystemsPrivate *newd = new QWritingSystemsPrivate(d);
        if (!d->ref.deref())
            delete d;
        d = newd;
    }
}